

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

Vec_Int_t * Tas_ManSolveMiterNc(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Tas_Man_t *p_00;
  Vec_Str_t *p_01;
  Vec_Int_t *vCexStore_00;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  abctime aVar5;
  bool bVar6;
  abctime clkTotal;
  abctime clk;
  int status;
  int i;
  Gia_Obj_t *pRoot;
  Vec_Str_t *vStatus;
  Vec_Int_t *vCexStore;
  Vec_Int_t *vVisit;
  Vec_Int_t *vCex;
  Tas_Man_t *p;
  int fVerbose_local;
  Vec_Str_t **pvStatus_local;
  int nConfs_local;
  Gia_Man_t *pAig_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Gia_ManRegNum(pAig);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x5f9,"Vec_Int_t *Tas_ManSolveMiterNc(Gia_Man_t *, int, Vec_Str_t **, int)");
  }
  Gia_ManCreateRefs(pAig);
  Gia_ManCleanMark0(pAig);
  Gia_ManCleanMark1(pAig);
  Gia_ManFillValue(pAig);
  Gia_ManCleanPhase(pAig);
  p_00 = Tas_ManAlloc(pAig,nConfs);
  p_00->pAig = pAig;
  iVar1 = Gia_ManPoNum(pAig);
  p_01 = Vec_StrAlloc(iVar1);
  vCexStore_00 = Vec_IntAlloc(10000);
  p_02 = Vec_IntAlloc(100);
  p_03 = Tas_ReadModel(p_00);
  clk._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pAig->vCos);
    bVar6 = false;
    if (clk._4_4_ < iVar1) {
      _status = Gia_ManCo(pAig,clk._4_4_);
      bVar6 = _status != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    Vec_IntClear(p_03);
    pGVar3 = Gia_ObjFanin0(_status);
    iVar1 = Gia_ObjIsConst0(pGVar3);
    if (iVar1 == 0) {
      aVar5 = Abc_Clock();
      (p_00->Pars).fUseHighest = 1;
      (p_00->Pars).fUseLowest = 0;
      pGVar3 = Gia_ObjChild0(_status);
      iVar1 = Tas_ManSolve(p_00,pGVar3,(Gia_Obj_t *)0x0);
      Vec_StrPush(p_01,(char)iVar1);
      if (iVar1 == -1) {
        p_00->nSatUndec = p_00->nSatUndec + 1;
        p_00->nConfUndec = (p_00->Pars).nBTThis + p_00->nConfUndec;
        Cec_ManSatAddToStore(vCexStore_00,(Vec_Int_t *)0x0,clk._4_4_);
        aVar4 = Abc_Clock();
        p_00->timeSatUndec = (aVar4 - aVar5) + p_00->timeSatUndec;
      }
      else if (iVar1 == 1) {
        p_00->nSatUnsat = p_00->nSatUnsat + 1;
        p_00->nConfUnsat = (p_00->Pars).nBTThis + p_00->nConfUnsat;
        aVar4 = Abc_Clock();
        p_00->timeSatUnsat = (aVar4 - aVar5) + p_00->timeSatUnsat;
      }
      else {
        p_00->nSatSat = p_00->nSatSat + 1;
        p_00->nConfSat = (p_00->Pars).nBTThis + p_00->nConfSat;
        Cec_ManSatAddToStore(vCexStore_00,p_03,clk._4_4_);
        aVar4 = Abc_Clock();
        p_00->timeSatSat = (aVar4 - aVar5) + p_00->timeSatSat;
      }
    }
    else {
      iVar1 = Gia_ObjFaninC0(_status);
      if (iVar1 == 0) {
        Vec_StrPush(p_01,'\x01');
      }
      else {
        Cec_ManSatAddToStore(vCexStore_00,p_03,clk._4_4_);
        Vec_StrPush(p_01,'\0');
      }
    }
    clk._4_4_ = clk._4_4_ + 1;
  }
  Vec_IntFree(p_02);
  iVar1 = Gia_ManPoNum(pAig);
  p_00->nSatTotal = iVar1;
  aVar5 = Abc_Clock();
  p_00->timeTotal = aVar5 - aVar2;
  if (fVerbose != 0) {
    Tas_ManSatPrintStats(p_00);
  }
  Tas_ManStop(p_00);
  *pvStatus = p_01;
  return vCexStore_00;
}

Assistant:

Vec_Int_t * Tas_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Gia_ManCollectTest( Gia_Man_t * pAig );
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Tas_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot;//, * pRootCopy; 
//    Gia_Man_t * pAigCopy = Gia_ManDup( pAig ), * pAigTemp;

    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
//    Gia_ManCollectTest( pAig );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    Gia_ManCleanMark0( pAig );
    Gia_ManCleanMark1( pAig );
    Gia_ManFillValue( pAig ); // maps nodes into trail ids
    Gia_ManCleanPhase( pAig ); // maps nodes into trail ids
    // create logic network
    p = Tas_ManAlloc( pAig, nConfs );
    p->pAig   = pAig;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Tas_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
//        printf( "%d=", i );

        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
//                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        } 
        clk = Abc_Clock();
//        p->Pars.fUseActive  = 1;
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;
        status = Tas_ManSolve( p, Gia_ObjChild0(pRoot), NULL );
//        printf( "\n" );
/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Tas_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
//            printf( "Unsolved %d.\n", i );

            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }

//        pRootCopy = Gia_ManCo( pAigCopy, i );
//        pRootCopy->iDiff0 = Gia_ObjId( pAigCopy, pRootCopy );
//        pRootCopy->fCompl0 = 0;

        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;

//        printf( "%d ", Vec_IntSize(vCex) );
    }
//    pAigCopy = Gia_ManCleanup( pAigTemp = pAigCopy );
//    Gia_ManStop( pAigTemp );
//    Gia_DumpAiger( pAigCopy, "test", 0, 2 );
//    Gia_ManStop( pAigCopy );

    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Tas_ManSatPrintStats( p );
//    printf( "RecCalls = %8d.  RecClause = %8d.  RecNonChro = %8d.\n", p->nRecCall, p->nRecClause, p->nRecNonChro );
    Tas_ManStop( p );
    *pvStatus = vStatus;

//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}